

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O3

void signalHandler(int sigNum)

{
  qpCrashHandler *pqVar1;
  char *pcVar2;
  long lVar3;
  qpCrashType qVar4;
  
  pqVar1 = g_crashHandler;
  lVar3 = 8;
  pcVar2 = "Unknown signal";
  do {
    if (*(int *)((long)&PTR_typeinfo_name_00789128 + lVar3) == sigNum) {
      qVar4 = *(qpCrashType *)((long)&PTR_typeinfo_name_00789128 + lVar3 + 4);
      pcVar2 = *(char **)((long)&s_signals[0].signalNum + lVar3);
      goto LAB_00619b42;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x68);
  qVar4 = QP_CRASHTYPE_OTHER;
LAB_00619b42:
  (g_crashHandler->crashInfo).type = qVar4;
  (pqVar1->crashInfo).message = pcVar2;
  (pqVar1->crashInfo).file = (char *)0x0;
  (pqVar1->crashInfo).line = 0;
  if (pqVar1->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*pqVar1->crashHandlerFunc)(pqVar1,pqVar1->handlerUserPointer);
    return;
  }
  return;
}

Assistant:

static void signalHandler (int sigNum)
{
	const SignalInfo*	info	= getSignalInfo(sigNum);
	qpCrashType			type	= info ? info->type : QP_CRASHTYPE_OTHER;
	const char*			name	= info ? info->name : "Unknown signal";

	qpCrashInfo_set(&g_crashHandler->crashInfo, type, name, DE_NULL, 0);

	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}